

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedFieldWrapper<int>::Add
          (RepeatedFieldWrapper<int> *this,Field *data,Value *value)

{
  int local_c;
  
  local_c = (*(this->super_RandomAccessRepeatedFieldAccessor).super_RepeatedFieldAccessor.
              _vptr_RepeatedFieldAccessor[0x10])(this,value);
  RepeatedField<int>::Add((RepeatedField<int> *)data,&local_c);
  return;
}

Assistant:

void Add(Field* data, const Value* value) const override {
    MutableRepeatedField(data)->Add(ConvertToT(value));
  }